

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O2

void __thiscall session::on_writable(session *this)

{
  buffer *this_00;
  socket_t fd;
  int iVar1;
  char *data;
  
  this_00 = &this->sendbuf_;
  while( true ) {
    if ((this->closed_ != false) || (iVar1 = buffer::size(this_00), iVar1 < 1)) goto LAB_00108756;
    fd = this->fd_;
    data = buffer::data(this_00);
    iVar1 = buffer::size(this_00);
    iVar1 = send_data(fd,data,iVar1);
    if (iVar1 < 0) break;
    if (iVar1 == 0) {
      iVar1 = 0;
      goto LAB_00108772;
    }
    buffer::pop_data(this_00,iVar1);
  }
  iVar1 = get_network_err();
  if (iVar1 != 0) {
LAB_00108772:
    on_error(this,iVar1);
    return;
  }
LAB_00108756:
  iVar1 = buffer::size(this_00);
  if (iVar1 < 1) {
    buffer::shrink(this_00);
    network::del_event(this->network_,&this->super_iobject,this->fd_,4);
    return;
  }
  return;
}

Assistant:

void session::on_writable()
{
    while (!closed_ && sendbuf_.size() > 0)
    {
        int send_len = send_data(fd_, sendbuf_.data(), sendbuf_.size());
        if (send_len < 0)
        {
            int error = get_network_err();
            if (error != 0)
            {
                on_error(error);
                return;
            }
            break;
        }

        if (send_len == 0)
        {
            on_error(0);
            return;
        }

        sendbuf_.pop_data(send_len);
    }

    if (sendbuf_.size() <= 0)
    {
        sendbuf_.shrink();
        network_->del_event(this, fd_, EVENT_WRITE);
    }
}